

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeWebAssemblyInstancePrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  RuntimeFunction *pRVar2;
  undefined8 in_RAX;
  uint uVar5;
  RuntimeFunction *pRVar3;
  StaticType *type;
  LiteralString *pLVar4;
  ulong uVar6;
  
  uVar5 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,3,0);
  this = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar6 = (ulong)uVar5 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(this->webAssemblyInstanceConstructor).ptr,6,0,0,uVar6);
  pRVar3 = CreateGetterFunction
                     (this,0xe8,(FunctionInfo *)WebAssemblyInstance::EntryInfo::GetterExports);
  pRVar2 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = pRVar2;
  }
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(prototype,0xe8,pRVar3,pRVar2,0);
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(prototype,0xe8,6);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar4 = LiteralString::New(type,L"WebAssembly.Instance",0x14,this->recycler);
    (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x1b,pLVar4,2,0,0,uVar6 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyInstancePrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 3);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyInstanceConstructor);
        library->AddAccessorsToLibraryObject(prototype, PropertyIds::exports, &WebAssemblyInstance::EntryInfo::GetterExports, nullptr);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Instance")), PropertyConfigurable);
        }
        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }